

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

ElseClauseSyntax * __thiscall slang::parsing::Parser::parseElseClause(Parser *this)

{
  Token elseKeyword_00;
  SourceRange range;
  bool bVar1;
  StatementSyntax *this_00;
  ConditionalStatementSyntax *pCVar2;
  SyntaxNode *in_RDI;
  Token TVar3;
  SourceRange SVar4;
  Token tok;
  StatementSyntax *stmt;
  Token elseKeyword;
  undefined1 in_stack_00000ad6;
  undefined1 in_stack_00000ad7;
  Parser *in_stack_00000ad8;
  TokenKind in_stack_ffffffffffffffae;
  SourceLocation in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar5;
  SourceLocation SVar6;
  DiagCode code;
  SyntaxFactory *local_20;
  Info *local_18;
  ElseClauseSyntax *local_8;
  
  bVar1 = ParserBase::peek((ParserBase *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae);
  if (bVar1) {
    TVar3 = ParserBase::consume((ParserBase *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    this_00 = parseStatement(in_stack_00000ad8,(bool)in_stack_00000ad7,(bool)in_stack_00000ad6);
    if ((this_00->super_SyntaxNode).kind == ConditionalStatement) {
      pCVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ConditionalStatementSyntax>
                         (&this_00->super_SyntaxNode);
      SVar6 = *(SourceLocation *)&pCVar2->uniqueOrPriority;
      code = SUB84((ulong)(pCVar2->uniqueOrPriority).info >> 0x20,0);
      bVar1 = Token::operator_cast_to_bool((Token *)0x6f312d);
      if (bVar1) {
        uVar5 = 0xbb0005;
        SVar4 = Token::range((Token *)CONCAT44(0xbb0005,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffffb0 = SVar4.startLoc;
        range.startLoc._4_4_ = uVar5;
        range.startLoc._0_4_ = in_stack_ffffffffffffffc0;
        range.endLoc = SVar6;
        ParserBase::addDiag((ParserBase *)SVar4.endLoc,code,range);
      }
    }
    local_20 = TVar3._0_8_;
    local_18 = TVar3.info;
    elseKeyword_00.info = (Info *)in_stack_ffffffffffffffb0;
    elseKeyword_00._0_8_ = local_18;
    local_8 = slang::syntax::SyntaxFactory::elseClause(local_20,elseKeyword_00,in_RDI);
  }
  else {
    local_8 = (ElseClauseSyntax *)0x0;
  }
  return local_8;
}

Assistant:

ElseClauseSyntax* Parser::parseElseClause() {
    if (peek(TokenKind::ElseKeyword)) {
        auto elseKeyword = consume();
        auto& stmt = parseStatement();
        if (stmt.kind == SyntaxKind::ConditionalStatement) {
            if (auto tok = stmt.as<ConditionalStatementSyntax>().uniqueOrPriority)
                addDiag(diag::UniquePriorityAfterElse, tok.range());
        }
        return &factory.elseClause(elseKeyword, stmt);
    }
    return nullptr;
}